

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O3

void __thiscall mkvparser::MkvReader::~MkvReader(MkvReader *this)

{
  (this->super_IMkvReader)._vptr_IMkvReader = (_func_int **)&PTR_Read_0013ed60;
  if ((this->reader_owns_file_ == true) && ((FILE *)this->m_file != (FILE *)0x0)) {
    fclose((FILE *)this->m_file);
  }
  operator_delete(this);
  return;
}

Assistant:

MkvReader::~MkvReader() {
  if (reader_owns_file_)
    Close();
  m_file = NULL;
}